

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

string * __thiscall
absl::lts_20240722::flags_internal::FlagImpl::CurrentValue_abi_cxx11_
          (string *__return_storage_ptr__,FlagImpl *this)

{
  flags_internal *pfVar1;
  FlagValueStorageKind FVar2;
  atomic<long> *paVar3;
  array<char,_8UL> val;
  void *__p;
  pointer dst;
  atomic<absl::lts_20240722::flags_internal::MaskedPointer> *this_00;
  FlagOpFn p_Var4;
  undefined8 in_RCX;
  void *pvVar5;
  allocator<char> local_81;
  MaskedPointer local_80;
  MutexLock local_78;
  MutexLock l;
  DynValueDeleter local_60;
  undefined1 local_58 [8];
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> cloned;
  array<char,_8UL> local_40;
  array<char,_8UL> one_word_val;
  Mutex *guard;
  FlagImpl *this_local;
  memory_order __b;
  
  one_word_val._M_elems = (_Type)DataGuard(this);
  FVar2 = ValueStorageKind(this);
  pvVar5 = (void *)CONCAT71((int7)((ulong)in_RCX >> 8),FVar2);
  if (FVar2 < kSequenceLocked) {
    paVar3 = OneWordValue(this);
    std::operator&(memory_order_acquire,__memory_order_mask);
    cloned._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>.
    _M_t.super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
    super__Head_base<0UL,_void_*,_false>._M_head_impl =
         (void *)(paVar3->super___atomic_base<long>)._M_i;
    val = bit_cast<std::array<char,_8UL>,_long,_0>
                    ((long *)&cloned._M_t.
                              super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>
                              .super__Head_base<0UL,_void_*,_false>);
    pfVar1 = (flags_internal *)this->op_;
    local_40 = val;
    p_Var4 = (FlagOpFn)std::array<char,_8UL>::data(&local_40);
    Unparse_abi_cxx11_(__return_storage_ptr__,pfVar1,p_Var4,(void *)val._M_elems);
  }
  else if (FVar2 == kSequenceLocked) {
    __p = Alloc(this->op_);
    pvVar5 = __p;
    DynValueDeleter::DynValueDeleter(&local_60,this->op_);
    std::unique_ptr<void,absl::lts_20240722::flags_internal::DynValueDeleter>::
    unique_ptr<absl::lts_20240722::flags_internal::DynValueDeleter,void>
              ((unique_ptr<void,absl::lts_20240722::flags_internal::DynValueDeleter> *)local_58,__p,
               &local_60);
    dst = std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::get
                    ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)
                     local_58);
    ReadSequenceLockedData(this,dst);
    pfVar1 = (flags_internal *)this->op_;
    p_Var4 = (FlagOpFn)
             std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::get
                       ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)
                        local_58);
    Unparse_abi_cxx11_(__return_storage_ptr__,pfVar1,p_Var4,pvVar5);
    std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::~unique_ptr
              ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)local_58);
  }
  else if (FVar2 == kHeapAllocated) {
    MutexLock::MutexLock(&local_78,(Mutex *)one_word_val._M_elems);
    pfVar1 = (flags_internal *)this->op_;
    this_00 = PtrStorage(this);
    local_80 = std::atomic<absl::lts_20240722::flags_internal::MaskedPointer>::load
                         (this_00,memory_order_acquire);
    p_Var4 = (FlagOpFn)MaskedPointer::Ptr(&local_80);
    Unparse_abi_cxx11_(__return_storage_ptr__,pfVar1,p_Var4,pvVar5);
    MutexLock::~MutexLock(&local_78);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_81);
    std::allocator<char>::~allocator(&local_81);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FlagImpl::CurrentValue() const {
  auto* guard = DataGuard();  // Make sure flag initialized
  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic: {
      const auto one_word_val =
          absl::bit_cast<std::array<char, sizeof(int64_t)>>(
              OneWordValue().load(std::memory_order_acquire));
      return flags_internal::Unparse(op_, one_word_val.data());
    }
    case FlagValueStorageKind::kSequenceLocked: {
      std::unique_ptr<void, DynValueDeleter> cloned(flags_internal::Alloc(op_),
                                                    DynValueDeleter{op_});
      ReadSequenceLockedData(cloned.get());
      return flags_internal::Unparse(op_, cloned.get());
    }
    case FlagValueStorageKind::kHeapAllocated: {
      absl::MutexLock l(guard);
      return flags_internal::Unparse(
          op_, PtrStorage().load(std::memory_order_acquire).Ptr());
    }
  }

  return "";
}